

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_consume.cc
# Opt level: O0

CordRep * absl::lts_20250127::cord_internal::anon_unknown_10::ClipSubstring
                    (CordRepSubstring *substring)

{
  CordRep *rep;
  bool bVar1;
  CordRep *child;
  CordRepSubstring *substring_local;
  
  rep = substring->child;
  bVar1 = RefcountAndFlags::IsOne(&(substring->super_CordRep).refcount);
  if (bVar1) {
    if (substring != (CordRepSubstring *)0x0) {
      operator_delete(substring,0x20);
    }
  }
  else {
    CordRep::Ref(rep);
    CordRep::Unref(&substring->super_CordRep);
  }
  return rep;
}

Assistant:

CordRep* ClipSubstring(CordRepSubstring* substring) {
  CordRep* child = substring->child;
  if (substring->refcount.IsOne()) {
    delete substring;
  } else {
    CordRep::Ref(child);
    CordRep::Unref(substring);
  }
  return child;
}